

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

NAMED * hashTableIterNext(HASH_TABLE_ITER *iter)

{
  NAMED *pNVar1;
  NAMED **ppNVar2;
  
  ppNVar2 = iter->p;
  do {
    if (ppNVar2 == iter->end) {
      return (NAMED *)0x0;
    }
    iter->p = ppNVar2 + 1;
    pNVar1 = *ppNVar2;
    ppNVar2 = ppNVar2 + 1;
  } while (pNVar1 == (NAMED *)0x0);
  return pNVar1;
}

Assistant:

static NAMED *FASTCALL
hashTableIterNext(HASH_TABLE_ITER *iter) {
  while (iter->p != iter->end) {
    NAMED *tem = *(iter->p)++;
    if (tem)
      return tem;
  }
  return NULL;
}